

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ecmult_constants(void)

{
  uchar *in_stack_00000120;
  size_t in_stack_00000128;
  uint32_t in_stack_00000134;
  
  if (COUNT < 1) {
    printf("Skipping %s (iteration count too low)\n","test_ecmult_constants_sha 1024");
  }
  else {
    test_ecmult_constants_sha(in_stack_00000134,in_stack_00000128,in_stack_00000120);
  }
  if (COUNT < 3) {
    printf("Skipping %s (iteration count too low)\n","test_ecmult_constants_sha 2048");
  }
  else {
    test_ecmult_constants_sha(in_stack_00000134,in_stack_00000128,in_stack_00000120);
  }
  if (COUNT < 0x10) {
    printf("Skipping %s (iteration count too low)\n","test_ecmult_constants_2bit");
  }
  else {
    test_ecmult_constants_2bit();
  }
  return;
}

Assistant:

static void run_ecmult_constants(void) {
    /* Expected hashes of all points in the tests below. Computed using an
     * independent implementation. */
    static const unsigned char expected32_6bit20[32] = {
        0x68, 0xb6, 0xed, 0x6f, 0x28, 0xca, 0xc9, 0x7f,
        0x8e, 0x8b, 0xd6, 0xc0, 0x61, 0x79, 0x34, 0x6e,
        0x5a, 0x8f, 0x2b, 0xbc, 0x3e, 0x1f, 0xc5, 0x2e,
        0x2a, 0xd0, 0x45, 0x67, 0x7f, 0x95, 0x95, 0x8e
    };
    static const unsigned char expected32_8bit8[32] = {
        0x8b, 0x65, 0x8e, 0xea, 0x86, 0xae, 0x3c, 0x95,
        0x90, 0xb6, 0x77, 0xa4, 0x8c, 0x76, 0xd9, 0xec,
        0xf5, 0xab, 0x8a, 0x2f, 0xfd, 0xdb, 0x19, 0x12,
        0x1a, 0xee, 0xe6, 0xb7, 0x6e, 0x05, 0x3f, 0xc6
    };
    /* For every combination of 6 bit positions out of 256, restricted to
     * 20-bit windows (i.e., the first and last bit position are no more than
     * 19 bits apart), all 64 bit patterns occur in the input scalars used in
     * this test. */
    CONDITIONAL_TEST(1, "test_ecmult_constants_sha 1024") {
        test_ecmult_constants_sha(4808378u, 1024, expected32_6bit20);
    }

    /* For every combination of 8 consecutive bit positions, all 256 bit
     * patterns occur in the input scalars used in this test. */
    CONDITIONAL_TEST(3, "test_ecmult_constants_sha 2048") {
        test_ecmult_constants_sha(1607366309u, 2048, expected32_8bit8);
    }

    CONDITIONAL_TEST(16, "test_ecmult_constants_2bit") {
        test_ecmult_constants_2bit();
    }
}